

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O0

void __thiscall
mocker::detail::RegisterAllocator::RegisterAllocator
          (RegisterAllocator *this,Section *section,LineIter funcBeg,LineIter funcEnd)

{
  Section *section_local;
  RegisterAllocator *this_local;
  LineIter funcEnd_local;
  LineIter funcBeg_local;
  
  this->section = section;
  (this->funcBeg)._M_node = funcBeg._M_node;
  (this->funcEnd)._M_node = funcEnd._M_node;
  InterferenceGraph::InterferenceGraph(&this->interG);
  MoveInfo::MoveInfo(&this->moveInfo);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::unordered_set(&this->spilledLastTime);
  return;
}

Assistant:

RegisterAllocator(nasm::Section &section, LineIter funcBeg, LineIter funcEnd)
      : section(section), funcBeg(funcBeg), funcEnd(funcEnd) {}